

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

LIndex __thiscall PlanningUnitMADPDiscrete::GetNrJointPolicies(PlanningUnitMADPDiscrete *this)

{
  int iVar1;
  undefined4 extraout_var;
  LIndex LVar2;
  EOverflow *this_00;
  uint agentI;
  ulong uVar3;
  bool bVar4;
  
  agentI = 0;
  uVar3 = 1;
  do {
    iVar1 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[6])(this);
    if (CONCAT44(extraout_var,iVar1) <= (ulong)agentI) {
      return uVar3;
    }
    LVar2 = GetNrPolicies(this,agentI);
    agentI = agentI + 1;
    bVar4 = uVar3 <= LVar2 * uVar3;
    uVar3 = LVar2 * uVar3;
  } while (bVar4);
  this_00 = (EOverflow *)__cxa_allocate_exception(0x28);
  EOverflow::EOverflow(this_00,"PlanningUnitMADPDiscrete::GetNrJointPolicies() overflow detected");
  __cxa_throw(this_00,&EOverflow::typeinfo,E::~E);
}

Assistant:

LIndex PlanningUnitMADPDiscrete::GetNrJointPolicies() const
{
    LIndex n=1;
    for(Index ag=0; ag < GetNrAgents(); ag++)
    {
        LIndex nOld=n;
        n *= GetNrPolicies(ag);
        if(n<nOld)
            throw(EOverflow("PlanningUnitMADPDiscrete::GetNrJointPolicies() overflow detected"));
    }
    return(n);
}